

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_split.cpp
# Opt level: O0

void __thiscall
WordSplitSVTest_three_words_Test<wchar_t>::TestBody(WordSplitSVTest_three_words_Test<wchar_t> *this)

{
  bool bVar1;
  char *pcVar2;
  reference pvVar3;
  AssertHelper local_168 [8];
  Message local_160 [12];
  int local_154;
  size_type local_150;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_3;
  Message local_130 [12];
  int local_124;
  size_type local_120;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_2;
  Message local_100 [12];
  int local_f4;
  size_type local_f0;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar_1;
  Message local_d0 [12];
  int local_c4;
  size_type local_c0;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  split_result;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> words;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_60;
  undefined1 local_30 [8];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> word;
  WordSplitSVTest_three_words_Test<wchar_t> *this_local;
  
  word.field_2._8_8_ = this;
  make_word<wchar_t,std::__cxx11::wstring>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_30,
             3,L'\0');
  std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>::
  operator+=((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_30,
             L'\0');
  make_word<wchar_t,std::__cxx11::wstring>(&local_60,5,L'\0');
  std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>::
  operator+=((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_30,
             &local_60);
  std::__cxx11::wstring::~wstring((wstring *)&local_60);
  std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>::
  operator+=((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_30,
             L'\0');
  std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>::
  operator+=((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_30,
             L'\0');
  make_word<wchar_t,std::__cxx11::wstring>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             &words._M_str,9,L'\0');
  std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>::
  operator+=((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_30,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             &words._M_str);
  std::__cxx11::wstring::~wstring((wstring *)&words._M_str);
  join_0x00000010_0x00000000_ =
       std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)local_30);
  jessilib::word_split<std::vector,_std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>
            ((container_type_conflict2 *)&gtest_ar.message_,
             (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)
             &split_result.
              super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  local_c0 = std::
             vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             ::size((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                     *)&gtest_ar.message_);
  local_c4 = 3;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_b8,"split_result.size()","3",&local_c0,&local_c4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(local_d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/word_split.cpp"
               ,0x7c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  pvVar3 = std::
           vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                         *)&gtest_ar.message_,0);
  local_f0 = std::__cxx11::
             basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>::size
                       (pvVar3);
  local_f4 = 3;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_e8,"split_result[0].size()","3",&local_f0,&local_f4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar1) {
    testing::Message::Message(local_100);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/word_split.cpp"
               ,0x7d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  pvVar3 = std::
           vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                         *)&gtest_ar.message_,1);
  local_120 = std::__cxx11::
              basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>::size
                        (pvVar3);
  local_124 = 5;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_118,"split_result[1].size()","5",&local_120,&local_124);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar1) {
    testing::Message::Message(local_130);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/word_split.cpp"
               ,0x7e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,local_130);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  pvVar3 = std::
           vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                         *)&gtest_ar.message_,2);
  local_150 = std::__cxx11::
              basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>::size
                        (pvVar3);
  local_154 = 9;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_148,"split_result[2].size()","9",&local_150,&local_154);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar1) {
    testing::Message::Message(local_160);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
    testing::internal::AssertHelper::AssertHelper
              (local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/word_split.cpp"
               ,0x7f,pcVar2);
    testing::internal::AssertHelper::operator=(local_168,local_160);
    testing::internal::AssertHelper::~AssertHelper(local_168);
    testing::Message::~Message(local_160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)&gtest_ar.message_);
  std::__cxx11::wstring::~wstring((wstring *)local_30);
  return;
}

Assistant:

TYPED_TEST(WordSplitSVTest, three_words) {
	auto word = make_word<TypeParam>(3);
	word += default_delim<TypeParam>;
	word += make_word<TypeParam>(5);
	word += default_delim<TypeParam>;
	word += default_delim<TypeParam>;
	word += make_word<TypeParam>(9);
	std::basic_string_view<TypeParam> words = word;
	std::vector<std::basic_string<TypeParam>> split_result = word_split(words, default_delim<TypeParam>);
	EXPECT_EQ(split_result.size(), 3);
	EXPECT_EQ(split_result[0].size(), 3);
	EXPECT_EQ(split_result[1].size(), 5);
	EXPECT_EQ(split_result[2].size(), 9);
}